

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O0

QList<QGraphicsItem_*> * __thiscall
QGraphicsSceneIndex::items
          (QGraphicsSceneIndex *this,QPainterPath *path,ItemSelectionMode mode,SortOrder order,
          QTransform *deviceTransform)

{
  long lVar1;
  undefined8 in_RSI;
  QTransform *in_RDI;
  long in_FS_OFFSET;
  QGraphicsSceneIndexPrivate *d;
  QList<QGraphicsItem_*> *itemList;
  QRectF exposeRect;
  ItemSelectionMode mode_00;
  QTransform *viewTransform;
  QList<QGraphicsItem_*> *items;
  QGraphicsSceneIndexIntersector intersect;
  QRectF *rect;
  QGraphicsSceneIndexPrivate *this_00;
  
  mode_00 = (ItemSelectionMode)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  viewTransform = in_RDI;
  d_func((QGraphicsSceneIndex *)0xa27d20);
  ((DataPointer *)in_RDI->m_matrix)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  ((DataPointer *)in_RDI->m_matrix)->ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  ((DataPointer *)in_RDI->m_matrix)->size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0xa27d54);
  items = (QList<QGraphicsItem_*> *)0xffffffffffffffff;
  intersect = (QGraphicsSceneIndexIntersector)0xffffffffffffffff;
  rect = (QRectF *)0xffffffffffffffff;
  this_00 = (QGraphicsSceneIndexPrivate *)0xffffffffffffffff;
  QPainterPath::controlPointRect();
  _q_adjustRect((QRectF *)0xa27d9d);
  QGraphicsSceneIndexPrivate::items_helper
            (this_00,rect,intersect,items,viewTransform,mode_00,order,path);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QList<QGraphicsItem_*> *)in_RDI;
}

Assistant:

QList<QGraphicsItem *> QGraphicsSceneIndex::items(const QPainterPath &path, Qt::ItemSelectionMode mode,
                                                  Qt::SortOrder order, const QTransform &deviceTransform) const
{
    Q_D(const QGraphicsSceneIndex);
    QList<QGraphicsItem *> itemList;
    QRectF exposeRect = path.controlPointRect();
    _q_adjustRect(&exposeRect);
    d->items_helper(exposeRect, &QtPrivate::intersect_path, &itemList, deviceTransform, mode, order, &path);
    return itemList;
}